

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

Memory google::protobuf::internal::AllocateMemory
                 (AllocationPolicy *policy_ptr,size_t last_size,size_t min_bytes)

{
  size_t sVar1;
  LogMessage *other;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  _func_void_ptr_size_t *p_Var5;
  Memory MVar6;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (policy_ptr == (AllocationPolicy *)0x0) {
    uVar3 = 0x2000;
    sVar1 = 0x100;
    p_Var5 = (_func_void_ptr_size_t *)0x0;
  }
  else {
    sVar1 = policy_ptr->start_block_size;
    uVar3 = policy_ptr->max_block_size;
    p_Var5 = policy_ptr->block_alloc;
  }
  uVar4 = last_size * 2;
  if (uVar3 < last_size * 2) {
    uVar4 = uVar3;
  }
  if (last_size == 0) {
    uVar4 = sVar1;
  }
  if (0xffffffffffffffe7 < min_bytes) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0x43);
    other = LogMessage::operator<<
                      (&local_58,
                       "CHECK failed: (min_bytes) <= (std::numeric_limits<size_t>::max() - SerialArena::kBlockHeaderSize): "
                      );
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  uVar3 = min_bytes + 0x18;
  if (min_bytes + 0x18 < uVar4) {
    uVar3 = uVar4;
  }
  if (p_Var5 == (_func_void_ptr_size_t *)0x0) {
    pvVar2 = operator_new(uVar3);
  }
  else {
    pvVar2 = (*p_Var5)(uVar3);
  }
  MVar6.size = uVar3;
  MVar6.ptr = pvVar2;
  return MVar6;
}

Assistant:

static SerialArena::Memory AllocateMemory(const AllocationPolicy* policy_ptr,
                                          size_t last_size, size_t min_bytes) {
  AllocationPolicy policy;  // default policy
  if (policy_ptr) policy = *policy_ptr;
  size_t size;
  if (last_size != 0) {
    // Double the current block size, up to a limit.
    auto max_size = policy.max_block_size;
    size = std::min(2 * last_size, max_size);
  } else {
    size = policy.start_block_size;
  }
  // Verify that min_bytes + kBlockHeaderSize won't overflow.
  GOOGLE_CHECK_LE(min_bytes,
           std::numeric_limits<size_t>::max() - SerialArena::kBlockHeaderSize);
  size = std::max(size, SerialArena::kBlockHeaderSize + min_bytes);

  void* mem;
  if (policy.block_alloc == nullptr) {
    mem = ::operator new(size);
  } else {
    mem = policy.block_alloc(size);
  }
  return {mem, size};
}